

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void hide_tractor_beam_command_proc(Am_Object *command_obj)

{
  Am_Value *pAVar1;
  char cVar2;
  bool bVar3;
  Am_Object *this;
  Am_Object beam;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)command_obj,0x169);
  Am_Object::Am_Object(&local_30,pAVar1);
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x69);
    bVar3 = Am_Value::operator_cast_to_bool(pAVar1);
    Am_Object::Set((ushort)&local_30,true,(ulong)!bVar3);
    if (bVar3) {
      this = &local_28;
      Am_Object::Am_Object(this,&local_30);
      remove_tractor_beam_from_both_ships(this);
    }
    else {
      this = &local_20;
      Am_Object::Am_Object(this,&local_30);
      add_tractor_beam_to_both_ships(this);
    }
    Am_Object::~Am_Object(this);
    Am_Object::Set((ushort)command_obj,true,(ulong)bVar3);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, hide_tractor_beam_command,
                 (Am_Object command_obj))
{
  Am_Object beam = (Am_Object)(command_obj.Get(Am_VALUE));
  if (beam.Valid()) {
    bool vis = beam.Get(Am_VISIBLE);
    beam.Set(Am_VISIBLE, !vis);
    if (!vis)
      add_tractor_beam_to_both_ships(beam);
    else
      remove_tractor_beam_from_both_ships(beam);
    command_obj.Set(Am_HAS_BEEN_UNDONE, vis); // opposite of visible
  }
}